

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser.cpp
# Opt level: O0

void __thiscall amrex::Parser::define(Parser *this,string *func_body)

{
  ulong uVar1;
  element_type *peVar2;
  YY_BUFFER_STATE b;
  string *in_RSI;
  runtime_error *e;
  YY_BUFFER_STATE buffer;
  string f;
  shared_ptr<amrex::Parser::Data> *in_stack_fffffffffffffe88;
  shared_ptr<amrex::Parser::Data> *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  string local_80 [32];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_41;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  string *local_10;
  
  local_10 = in_RSI;
  std::make_shared<amrex::Parser::Data>();
  std::shared_ptr<amrex::Parser::Data>::operator=
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::shared_ptr<amrex::Parser::Data>::~shared_ptr((shared_ptr<amrex::Parser::Data> *)0x161baf0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x161bb1c);
    std::__cxx11::string::operator=((string *)peVar2,local_10);
    peVar2 = std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x161bb33);
    std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x161bb42);
    local_38 = std::__cxx11::string::begin();
    std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x161bb5c);
    local_40 = std::__cxx11::string::end();
    local_41 = 10;
    local_30 = (char *)std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                 (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                  in_stack_fffffffffffffe98);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe90,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe88);
    std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x161bbb8);
    local_58 = std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe90,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe88);
    local_60 = std::__cxx11::string::erase(peVar2,local_28,local_50);
    std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x161bc09);
    std::operator+(&peVar2->m_expression,(char *)local_10);
    std::__cxx11::string::c_str();
    amrex_parser_scan_string((char *)in_stack_fffffffffffffe90);
    amrex_parserparse();
    b = (YY_BUFFER_STATE)amrex_parser_new();
    peVar2 = std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x161be62);
    peVar2->m_parser = (amrex_parser *)b;
    amrex_parser_delete_buffer(b);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

void
Parser::define (std::string const& func_body)
{
    m_data = std::make_shared<Data>();

    if (!func_body.empty()) {
        m_data->m_expression = func_body;
        m_data->m_expression.erase(std::remove(m_data->m_expression.begin(),
                                               m_data->m_expression.end(),'\n'),
                                   m_data->m_expression.end());
        std::string f = m_data->m_expression + "\n";

        YY_BUFFER_STATE buffer = amrex_parser_scan_string(f.c_str());
        try {
            amrex_parserparse();
        } catch (const std::runtime_error& e) {
            throw std::runtime_error(std::string(e.what()) + " in Parser expression \""
                                     + m_data->m_expression + "\"");
        }
        m_data->m_parser = amrex_parser_new();
        amrex_parser_delete_buffer(buffer);
    }
}